

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Disk::Sample(Disk *this,Point2f *u)

{
  undefined8 *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  Float FVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Normal3<float> NVar6;
  Normal3f n;
  Point3fi pi;
  Point3f pObj;
  Point2f pd;
  Point3fi *in_stack_00000368;
  Transform *in_stack_00000370;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  Normal3<float> *in_stack_fffffffffffffeb0;
  optional<pbrt::ShapeSample> *this_00;
  optional<pbrt::ShapeSample> *n_00;
  Point3fi *pi_00;
  Interaction *this_01;
  Point2f *in_stack_fffffffffffffee8;
  optional<pbrt::ShapeSample> local_100;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_78;
  float local_70;
  Tuple3<pbrt::Normal3,float> local_68 [8];
  float local_60;
  Normal3<float> *in_stack_ffffffffffffffb8;
  Transform *in_stack_ffffffffffffffc0;
  Point3fi local_2c;
  undefined1 extraout_var [56];
  undefined1 auVar5 [56];
  
  n_00 = in_RDI;
  auVar2._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffee8);
  FVar1 = (Float)((ulong)in_RDI >> 0x20);
  auVar2._8_56_ = extraout_var;
  local_2c.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  _12_8_ = vmovlpd_avx(auVar2._0_16_);
  pi_00 = &local_2c;
  Point3<float>::Point3
            ((Point3<float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
             in_stack_fffffffffffffea8,0.0);
  this_01 = (Interaction *)*in_RSI;
  Point3fi::Point3fi((Point3fi *)this_01,(Point3f *)pi_00);
  Transform::operator()(in_stack_00000370,in_stack_00000368);
  auVar5 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Normal3<float>::Normal3
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0.0);
  NVar6 = Transform::operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_90 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar3._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_98 = vmovlpd_avx(auVar3._0_16_);
  local_78 = local_98;
  local_70 = local_90;
  NVar6 = Normalize<float>((Normal3<float> *)this_01);
  local_a0 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar4._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_100._88_8_ = vmovlpd_avx(auVar4._0_16_);
  local_68 = (Tuple3<pbrt::Normal3,float>  [8])local_100._88_8_;
  local_60 = local_a0;
  if ((*(byte *)(in_RSI + 2) & 1) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=(local_68,-1);
  }
  this_00 = &local_100;
  Point2<float>::Point2((Point2<float> *)this_00);
  Interaction::Interaction(this_01,pi_00,(Normal3f *)n_00,FVar1,(Point2f *)this_00);
  FVar1 = Area((Disk *)this_00);
  local_100.optionalValue._80_4_ = 1.0 / FVar1;
  pstd::optional<pbrt::ShapeSample>::optional
            (this_00,(ShapeSample *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  return n_00;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Point2f pd = SampleUniformDiskConcentric(u);
        Point3f pObj(pd.x * radius, pd.y * radius, height);
        Point3fi pi = (*renderFromObject)(Point3fi(pObj));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(0, 0, 1)));
        if (reverseOrientation)
            n *= -1;
        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }